

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

void err_set_logfp(FILE *stream)

{
  FILE *stream_local;
  
  logfp = stream;
  if (stream == (FILE *)0x0) {
    logfp = (FILE *)0x0;
  }
  logfp_disabled = (int)(stream == (FILE *)0x0);
  return;
}

Assistant:

void
err_set_logfp(FILE *stream)
{
    if (stream == NULL) {
	logfp_disabled = TRUE;
	logfp = NULL;
	return;
    }    
    logfp_disabled = FALSE;
    logfp = stream;
    return;
}